

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

optional<wallet::SelectionResult> *
wallet::coinselector_tests::SelectCoinsBnB
          (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount *selection_target,CAmount *cost_of_change)

{
  long lVar1;
  bool bVar2;
  T *this;
  optional<wallet::SelectionResult> *in_RDI;
  long in_FS_OFFSET;
  Result<wallet::SelectionResult> res;
  Result<wallet::SelectionResult> *in_stack_ffffffffffffff28;
  SelectionResult *in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet::SelectCoinsBnB
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._112_8_,
             (CAmount *)
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._104_8_,
             (CAmount *)
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._96_8_,
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._92_4_);
  bVar2 = util::Result::operator_cast_to_bool(in_stack_ffffffffffffff28);
  if (bVar2) {
    this = util::Result<wallet::SelectionResult>::operator*(in_stack_ffffffffffffff28);
    std::optional<wallet::SelectionResult>::optional<wallet::SelectionResult_&,_true>
              ((optional<wallet::SelectionResult> *)this,in_stack_ffffffffffffff30);
  }
  else {
    std::optional<wallet::SelectionResult>::optional(in_RDI);
  }
  util::Result<wallet::SelectionResult>::~Result(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<SelectionResult> SelectCoinsBnB(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, const CAmount& cost_of_change)
{
    auto res{SelectCoinsBnB(utxo_pool, selection_target, cost_of_change, MAX_STANDARD_TX_WEIGHT)};
    return res ? std::optional<SelectionResult>(*res) : std::nullopt;
}